

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::RandomDropFilterOperation::set
          (RandomDropFilterOperation *this,string_view property,double val)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  size_t in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  double in_RDI;
  __atomic_float<double> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  
  pbVar2 = in_RSI;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  __x._M_str = (char *)pbVar2;
  __x._M_len = in_stack_ffffffffffffffc8;
  __y._M_str = in_stack_ffffffffffffffc0;
  __y._M_len = in_stack_ffffffffffffffb8;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RSI,in_stack_ffffffffffffffa8);
    __x_00._M_str = (char *)pbVar2;
    __x_00._M_len = in_stack_ffffffffffffffc8;
    __y_00._M_str = in_stack_ffffffffffffffc0;
    __y_00._M_len = in_RDX;
    bVar1 = std::operator==(__x_00,__y_00);
    if (!bVar1) {
      return;
    }
  }
  std::__atomic_float<double>::operator=(in_stack_ffffffffffffffa0,in_RDI);
  return;
}

Assistant:

void RandomDropFilterOperation::set(std::string_view property, double val)
{
    if ((property == "dropprob") || (property == "prob")) {
        dropProb = val;
    }
}